

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O2

void __thiscall
testing::
Action<ot::commissioner::Error_(ot::commissioner::PendingOperationalDataset_&,_unsigned_short)>::
Action(Action<ot::commissioner::Error_(ot::commissioner::PendingOperationalDataset_&,_unsigned_short)>
       *this,ActionInterface<ot::commissioner::Error_(ot::commissioner::PendingOperationalDataset_&,_unsigned_short)>
             *impl)

{
  __shared_ptr<testing::ActionInterface<ot::commissioner::Error(ot::commissioner::PendingOperationalDataset&,unsigned_short)>,(__gnu_cxx::_Lock_policy)2>
  local_20 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  std::
  __shared_ptr<testing::ActionInterface<ot::commissioner::Error(ot::commissioner::PendingOperationalDataset&,unsigned_short)>,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<testing::ActionInterface<ot::commissioner::Error(ot::commissioner::PendingOperationalDataset&,unsigned_short)>,void>
            (local_20,impl);
  std::
  function<ot::commissioner::Error(ot::commissioner::PendingOperationalDataset&,unsigned_short)>::
  function<testing::Action<ot::commissioner::Error(ot::commissioner::PendingOperationalDataset&,unsigned_short)>::ActionAdapter,void>
            ((function<ot::commissioner::Error(ot::commissioner::PendingOperationalDataset&,unsigned_short)>
              *)this,(ActionAdapter *)local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  return;
}

Assistant:

explicit Action(ActionInterface<F>* impl)
      : fun_(ActionAdapter{::std::shared_ptr<ActionInterface<F>>(impl)}) {}